

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O2

void icu_63::initializeEras(UErrorCode *status)

{
  int iVar1;
  char *str1;
  bool includeTentativeEra;
  
  str1 = getenv("ICU_ENABLE_TENTATIVE_ERA");
  if (str1 == (char *)0x0) {
    includeTentativeEra = false;
  }
  else {
    iVar1 = uprv_stricmp_63(str1,"true");
    includeTentativeEra = iVar1 == 0;
  }
  gJapaneseEraRules = EraRules::createInstance("japanese",includeTentativeEra,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    gCurrentEra = gJapaneseEraRules->currentEra;
  }
  return;
}

Assistant:

static void U_CALLCONV initializeEras(UErrorCode &status) {
    // Although start date of next Japanese era is planned ahead, a name of
    // new era might not be available. This implementation allows tester to
    // check a new era without era names by settings below (in priority order).
    // By default, such tentative era is disabled.

    // 1. Environment variable ICU_ENABLE_TENTATIVE_ERA=true or false

    UBool includeTentativeEra = FALSE;

#if U_PLATFORM_HAS_WINUWP_API == 1
    // UWP doesn't allow access to getenv(), but we can call GetEnvironmentVariableW to do the same thing.
    UChar varName[26] = {};
    u_charsToUChars(TENTATIVE_ERA_VAR_NAME, varName, static_cast<int32_t>(uprv_strlen(TENTATIVE_ERA_VAR_NAME)));
    WCHAR varValue[5] = {};
    DWORD ret = GetEnvironmentVariableW(reinterpret_cast<WCHAR*>(varName), varValue, UPRV_LENGTHOF(varValue));
    if ((ret == 4) && (_wcsicmp(varValue, L"true") == 0)) {
        includeTentativeEra = TRUE;
    }
#else
    char *envVarVal = getenv(TENTATIVE_ERA_VAR_NAME);
    if (envVarVal != NULL && uprv_stricmp(envVarVal, "true") == 0) {
        includeTentativeEra = TRUE;
    }
#endif
    gJapaneseEraRules = EraRules::createInstance("japanese", includeTentativeEra, status);
    if (U_FAILURE(status)) {
        return;
    }
    gCurrentEra = gJapaneseEraRules->getCurrentEraIndex();
}